

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O1

float64 helper_vfp_fcvt_f16_to_f64_arm(uint32_t a,void *fpstp,uint32_t ahp_mode)

{
  undefined1 uVar1;
  float64 fVar2;
  
  uVar1 = *(undefined1 *)((long)fpstp + 5);
  *(undefined1 *)((long)fpstp + 5) = 0;
  fVar2 = float16_to_float64_arm((float16)a,ahp_mode == 0,(float_status *)fpstp);
  *(undefined1 *)((long)fpstp + 5) = uVar1;
  return fVar2;
}

Assistant:

float64 HELPER(vfp_fcvt_f16_to_f64)(uint32_t a, void *fpstp, uint32_t ahp_mode)
{
    /* Squash FZ16 to 0 for the duration of conversion.  In this case,
     * it would affect flushing input denormals.
     */
    float_status *fpst = fpstp;
    flag save = get_flush_inputs_to_zero(fpst);
    set_flush_inputs_to_zero(false, fpst);
    float64 r = float16_to_float64(a, !ahp_mode, fpst);
    set_flush_inputs_to_zero(save, fpst);
    return r;
}